

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Superposition.cpp
# Opt level: O3

Clause * __thiscall
Inferences::Superposition::performSuperposition
          (Superposition *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,AbstractingUnifier *unifier,bool eqIsResult)

{
  PassiveClauseContainer *passiveClauseContainer;
  PartialRedundancyHandler *pPVar1;
  Ordering *this_00;
  _Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false> _Var2;
  uint numPositiveLiteralsLowerBound;
  ResultSubstitution *pRVar3;
  RefCounter *pRVar4;
  Self SVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  Result RVar11;
  void **head_1;
  TermList sort;
  TermList TVar12;
  SaturationAlgorithm *pSVar13;
  Literal *pLVar14;
  TermList trm;
  Literal *pLVar15;
  ulong uVar16;
  TermList arg1_00;
  Literal *pLVar17;
  Literal *pLVar18;
  undefined8 *puVar19;
  undefined7 extraout_var;
  undefined7 uVar27;
  ulong uVar20;
  long *plVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  AnswerLiteralManager *pAVar25;
  undefined4 extraout_var_00;
  Clause *pCVar26;
  InferenceExtra *extra;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar28;
  long lVar29;
  ulong uVar30;
  void **head;
  long lVar31;
  RefIterator it;
  bool andThatsIt;
  Clause *local_180;
  undefined4 local_174;
  Clause *local_170;
  ResultSubstitutionSP subst;
  uint local_118;
  Destroyer inf_destroyer;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> res;
  TermList arg1;
  ResultSubstitutionSP local_a8;
  Inference inf;
  Inference local_68;
  
  local_180 = eqClause;
  local_170 = rwClause;
  Indexing::ResultSubstitution::fromSubstitution
            ((ResultSubstitution *)&subst,
             (RobSubstitution *)
             (unifier->_subs)._self._M_t.
             super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
             .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>,0,1);
  sort = Kernel::SortHelper::getEqualityArgumentSort(eqLit);
  if ((((eqLHS._content & 1) != 0) &&
      (bVar6 = checkSuperpositionFromVariable(local_180,eqLit,eqLHS), !bVar6)) ||
     (bVar6 = checkClauseColorCompatibility(this,local_180,local_170), pCVar26 = local_180, !bVar6))
  {
    pCVar26 = (Clause *)0x0;
    goto LAB_0051052b;
  }
  uVar30 = *(ulong *)&local_170->field_0x38;
  uVar20 = *(ulong *)&local_180->field_0x38;
  TVar12 = Kernel::EqHelper::getOtherEqualitySide(eqLit,eqLHS);
  uVar8 = Kernel::Clause::numPositiveLiterals(pCVar26);
  pCVar26 = local_170;
  uVar9 = Kernel::Clause::numPositiveLiterals(local_170);
  numPositiveLiteralsLowerBound = uVar8 - 1;
  if ((int)(uVar8 - 1) <= (int)uVar9) {
    numPositiveLiteralsLowerBound = uVar9;
  }
  res._self._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
        )(CONCAT71(res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl._1_7_
                   ,((unifier->_uwa)._mode != OFF) * '\x02') | 0x3c);
  res._8_8_ = pCVar26;
  Kernel::Inference::Inference(&inf,(GeneratingInference2 *)&res);
  passiveClauseContainer =
       (((this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
         super_InferenceEngine._salg)->_passive)._M_t.
       super___uniq_ptr_impl<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
       ._M_t.
       super__Tuple_impl<0UL,_Saturation::PassiveClauseContainer_*,_std::default_delete<Saturation::PassiveClauseContainer>_>
       .super__Head_base<0UL,_Saturation::PassiveClauseContainer_*,_false>._M_head_impl;
  andThatsIt = false;
  inf_destroyer._destroyee = &inf;
  if ((passiveClauseContainer == (PassiveClauseContainer *)0x0) ||
     (cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer).
                                     super_ClauseContainer + 0x78))(), cVar7 == '\0')) {
LAB_0050fbac:
    local_174 = 0;
LAB_0050fbb4:
    pSVar13 = (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
              super_InferenceEngine._salg;
    pPVar1 = (pSVar13->_partialRedundancyHandler)._M_t.
             super___uniq_ptr_impl<Shell::PartialRedundancyHandler,_std::default_delete<Shell::PartialRedundancyHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Shell::PartialRedundancyHandler_*,_std::default_delete<Shell::PartialRedundancyHandler>_>
             .super__Head_base<0UL,_Shell::PartialRedundancyHandler_*,_false>._M_head_impl;
    if ((unifier->_uwa)._mode == OFF) {
      iVar10 = (*pPVar1->_vptr_PartialRedundancyHandler[2])
                         (pPVar1,local_180,eqLit,local_170,rwLit,(ulong)eqIsResult,subst._obj);
      if ((char)iVar10 == '\0') goto LAB_0050fcb6;
      pSVar13 = (this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                super_InferenceEngine._salg;
    }
    this_00 = (pSVar13->_ordering)._obj;
    lVar31 = 0x10;
    if (eqIsResult) {
      lVar31 = 0x28;
    }
    TVar12._content =
         (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar31))
                   (subst._obj,TVar12._content);
    lVar28 = 0x30;
    if (eqIsResult) {
      lVar28 = 0x18;
    }
    pLVar14 = (Literal *)
              (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar28))(subst._obj,rwLit)
    ;
    lVar29 = 0x28;
    if (eqIsResult) {
      lVar29 = 0x10;
    }
    trm._content = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar29))
                             (subst._obj,rwTerm._content);
    uVar8 = (*this_00->_vptr_Ordering[3])(this_00,TVar12._content,trm._content);
    if ((uVar8 & 0xfffffffd) != 1) {
      if ((pLVar14->super_Term)._functor == 0) {
        uVar16 = (ulong)(*(uint *)&(pLVar14->super_Term).field_0xc & 0xfffffff);
        res._self._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(pLVar14->super_Term)._args[uVar16]._content;
        arg1._content = (pLVar14->super_Term)._args[uVar16 - 1]._content;
        bVar6 = Kernel::TermList::containsSubterm((TermList *)&res,trm);
        if (bVar6) {
          bVar6 = Kernel::TermList::containsSubterm(&arg1,trm);
          if (!bVar6) {
            RVar11 = Kernel::Ordering::getEqualityArgumentOrder(this_00,pLVar14);
            if (RVar11 - EQUAL < 2) {
              if ((RVar11 & ~LESS) != GREATER) goto LAB_0050fccd;
            }
            else if (RVar11 == GREATER) goto LAB_0050fccd;
            goto LAB_0050fcb6;
          }
        }
        else {
          RVar11 = Kernel::Ordering::getEqualityArgumentOrder(this_00,pLVar14);
          if ((RVar11 & ~LESS) == GREATER) goto LAB_0050fcb6;
        }
      }
LAB_0050fccd:
      if ((unifier->_uwa)._mode == OFF) {
        (*pPVar1->_vptr_PartialRedundancyHandler[3])
                  (pPVar1,local_180,local_170,trm._content,TVar12._content,eqLHS._content,pLVar14,
                   eqLit,(ulong)uVar8,(ulong)eqIsResult,subst._obj);
      }
      pLVar15 = Kernel::EqHelper::replace(pLVar14,trm,TVar12);
      if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
           ::doSimS == '\0') &&
         (iVar10 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                        ::doSimS), iVar10 != 0)) {
        iVar10 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                   super_InferenceEngine._vptr_InferenceEngine[4])(this);
        performSuperposition::doSimS = *(bool *)(CONCAT44(extraout_var_01,iVar10) + 0x49da);
        __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                             ::doSimS);
      }
      if ((((pLVar15->super_Term)._functor != 0) ||
          (((pLVar15->super_Term)._args[0]._content & 4) == 0)) ||
         (uVar16 = (ulong)(*(uint *)&(pLVar15->super_Term).field_0xc & 0xfffffff),
         (pLVar15->super_Term)._args[uVar16]._content !=
         (pLVar15->super_Term)._args[uVar16 - 1]._content)) {
        arg1_00._content =
             (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar31))
                       (subst._obj,eqLHS._content);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        Recycled(&res);
        uVar8 = (uint)uVar30;
        local_118 = (uint)uVar20;
        _Var2._M_head_impl =
             (unifier->_constr)._self._M_t.
             super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
             ._M_t.
             super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
             .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>._M_head_impl;
        Lib::Stack<Kernel::Literal_*>::reserve
                  ((Stack<Kernel::Literal_*> *)
                   res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                   (ulong)(((int)((ulong)((long)((_Var2._M_head_impl)->_cont)._cursor -
                                         (long)((_Var2._M_head_impl)->_cont)._stack) >> 4) *
                            -0x55555555 + (uVar8 & 0xfffff) + (local_118 & 0xfffff)) - 1));
        if (*(int *)(Lib::env + 0x8898) == 2) {
          pLVar17 = Kernel::Clause::getAnswerLiteral(local_170);
          pLVar18 = Kernel::Clause::getAnswerLiteral(local_180);
        }
        else {
          pLVar17 = (Literal *)0x0;
          pLVar18 = (Literal *)0x0;
        }
        if ((performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
             ::afterCheck == '\0') &&
           (iVar10 = __cxa_guard_acquire(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                                          ::afterCheck), iVar10 != 0)) {
          iVar10 = (*(this->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                     super_InferenceEngine._vptr_InferenceEngine[4])(this);
          if (*(char *)(CONCAT44(extraout_var_02,iVar10) + 0x1502) == '\x01') {
            iVar10 = (*((((this->super_GeneratingInferenceEngine).
                          super_SimplifyingGeneratingInference.super_InferenceEngine._salg)->
                        _selector)._obj)->_vptr_LiteralSelector[2])();
            performSuperposition::afterCheck = SUB41(iVar10,0);
          }
          else {
            performSuperposition::afterCheck = false;
          }
          __cxa_guard_release(&performSuperposition(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::AbstractingUnifier*,bool)
                               ::afterCheck);
        }
        SVar5._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             res._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
        puVar19 = *(undefined8 **)
                   ((long)res._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        if (puVar19 ==
            *(undefined8 **)
             ((long)res._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x18)) {
          Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     res._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
          puVar19 = *(undefined8 **)
                     ((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10);
        }
        *puVar19 = pLVar15;
        plVar21 = (long *)((long)SVar5._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl + 0x10);
        *plVar21 = *plVar21 + 8;
        uVar9 = (pLVar15->super_Term)._weight;
        if ((uVar30 & 0xfffff) != 0) {
          uVar30 = 0;
          do {
            if ((local_170->_literals[uVar30] != rwLit) &&
               (local_170->_literals[uVar30] != pLVar17 ||
                (pLVar17 == (Literal *)0x0 || pLVar18 == (Literal *)0x0))) {
              pLVar15 = (Literal *)
                        (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar28))();
              if (performSuperposition::doSimS == true) {
                pLVar15 = Kernel::EqHelper::replace(pLVar15,trm,TVar12);
              }
              if ((((pLVar15->super_Term)._functor == 0) &&
                  (((pLVar15->super_Term)._args[0]._content & 4) != 0)) &&
                 (uVar16 = (ulong)(*(uint *)&(pLVar15->super_Term).field_0xc & 0xfffffff),
                 (pLVar15->super_Term)._args[uVar16]._content ==
                 (pLVar15->super_Term)._args[uVar16 - 1]._content)) goto LAB_00510436;
              if ((char)local_174 != '\0') {
                uVar9 = uVar9 + (pLVar15->super_Term)._weight;
                cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->
                                               super_RandomAccessClauseContainer).
                                               super_ClauseContainer + 0x88))
                                  (passiveClauseContainer,uVar9,numPositiveLiteralsLowerBound,&inf);
                if (cVar7 != '\0') goto LAB_005103c3;
              }
              if (((performSuperposition::afterCheck == true) &&
                  (uVar30 < (*(uint *)&local_170->field_0x3c & 0xfffff))) &&
                 (iVar10 = (*this_00->_vptr_Ordering[2])(this_00,pLVar15,pLVar14), iVar10 == 1))
              goto LAB_00510425;
              SVar5._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                   res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
              puVar19 = *(undefined8 **)
                         ((long)res._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10);
              if (puVar19 ==
                  *(undefined8 **)
                   ((long)res._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x18)) {
                Lib::Stack<Kernel::Literal_*>::expand
                          ((Stack<Kernel::Literal_*> *)
                           res._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl);
                puVar19 = *(undefined8 **)
                           ((long)SVar5._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                  _M_head_impl + 0x10);
              }
              *puVar19 = pLVar15;
              plVar21 = (long *)((long)SVar5._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       .
                                       super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                       ._M_head_impl + 0x10);
              *plVar21 = *plVar21 + 8;
            }
            uVar30 = uVar30 + 1;
          } while ((uVar8 & 0xfffff) != uVar30);
        }
        if (performSuperposition::afterCheck == true) {
          if ((*(uint *)&local_180->field_0x3b & 0xffffe00) == 0) {
            pLVar14 = (Literal *)0x0;
          }
          else {
            pLVar14 = Kernel::Literal::createEquality(true,arg1_00,TVar12,sort);
          }
        }
        else {
          pLVar14 = (Literal *)0x0;
        }
        if ((uVar20 & 0xfffff) != 0) {
          lVar31 = 0x18;
          if (eqIsResult) {
            lVar31 = 0x30;
          }
          uVar30 = 0;
          do {
            if (local_180->_literals[uVar30] != eqLit) {
              lVar29 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar31))();
              if (((*(int *)(lVar29 + 8) == 0) && ((*(byte *)(lVar29 + 0x28) & 4) != 0)) &&
                 (uVar20 = (ulong)(*(uint *)(lVar29 + 0xc) & 0xfffffff),
                 *(long *)(lVar29 + 0x28 + uVar20 * 8) == *(long *)(lVar29 + 0x20 + uVar20 * 8)))
              goto LAB_00510436;
              if ((char)local_174 != '\0') {
                uVar9 = uVar9 + *(int *)(lVar29 + 0x10);
                cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->
                                               super_RandomAccessClauseContainer).
                                               super_ClauseContainer + 0x88))
                                  (passiveClauseContainer,uVar9,numPositiveLiteralsLowerBound,&inf);
                if (cVar7 != '\0') goto LAB_005103c3;
              }
              if (((pLVar14 != (Literal *)0x0) &&
                  (uVar30 < (*(uint *)&local_180->field_0x3c & 0xfffff))) &&
                 (uVar8 = (*this_00->_vptr_Ordering[2])(this_00,lVar29,pLVar14),
                 (uVar8 & 0xfffffffd) == 1)) goto LAB_00510425;
              SVar5._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                   res._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
              plVar21 = *(long **)((long)res._self._M_t.
                                         super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                         .
                                         super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                         ._M_head_impl + 0x10);
              if (plVar21 ==
                  *(long **)((long)res._self._M_t.
                                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                   _M_head_impl + 0x18)) {
                Lib::Stack<Kernel::Literal_*>::expand
                          ((Stack<Kernel::Literal_*> *)
                           res._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl);
                plVar21 = *(long **)((long)SVar5._M_t.
                                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                           .
                                           super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                           ._M_head_impl + 0x10);
              }
              *plVar21 = lVar29;
              plVar21 = (long *)((long)SVar5._M_t.
                                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                       .
                                       super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>
                                       ._M_head_impl + 0x10);
              *plVar21 = *plVar21 + 8;
            }
            uVar30 = uVar30 + 1;
          } while ((local_118 & 0xfffff) != uVar30);
        }
        SVar5._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             res._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl;
        Kernel::UnificationConstraintStack::literals
                  ((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)&arg1,(unifier->_constr)._self._M_t.
                            super___uniq_ptr_impl<Kernel::UnificationConstraintStack,_std::default_delete<Kernel::UnificationConstraintStack>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Kernel::UnificationConstraintStack_*,_std::default_delete<Kernel::UnificationConstraintStack>_>
                            .super__Head_base<0UL,_Kernel::UnificationConstraintStack_*,_false>.
                            _M_head_impl,
                   (RobSubstitution *)
                   (unifier->_subs)._self._M_t.
                   super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
                   .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>);
        it._stack = (Stack<Kernel::Literal_*> *)arg1._content;
        it._pointer = *(Literal ***)(arg1._content + 0x10);
        Lib::Stack<Kernel::Literal*>::loadFromIterator<Lib::Stack<Kernel::Literal*>::RefIterator>
                  ((Stack<Kernel::Literal*> *)
                   SVar5._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,it);
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                   *)&arg1);
        if (pLVar17 != (Literal *)0x0 && pLVar18 != (Literal *)0x0) {
          uVar22 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar28))
                             (subst._obj,pLVar17);
          lVar31 = 0x18;
          if (eqIsResult) {
            lVar31 = 0x30;
          }
          uVar23 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar31))
                             (subst._obj,pLVar18);
          uVar24 = (**(code **)((long)(subst._obj)->_vptr_ResultSubstitution + lVar31))
                             (subst._obj,eqLit);
          SVar5 = res._self;
          pAVar25 = Shell::AnswerLiteralManager::getInstance();
          iVar10 = (*pAVar25->_vptr_AnswerLiteralManager[5])(pAVar25,uVar24,uVar22,uVar23);
          puVar19 = *(undefined8 **)
                     ((long)SVar5._M_t.
                            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                            _M_head_impl + 0x10);
          if (puVar19 ==
              *(undefined8 **)
               ((long)SVar5._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
               0x18)) {
            Lib::Stack<Kernel::Literal_*>::expand
                      ((Stack<Kernel::Literal_*> *)
                       SVar5._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
            puVar19 = *(undefined8 **)
                       ((long)SVar5._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x10);
          }
          *puVar19 = CONCAT44(extraout_var_00,iVar10);
          *(long *)((long)SVar5._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10) =
               *(long *)((long)SVar5._M_t.
                               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                               _M_head_impl + 0x10) + 8;
        }
        if (((char)local_174 != '\0') &&
           (cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->
                                           super_RandomAccessClauseContainer).super_ClauseContainer
                                + 0x88))
                              (passiveClauseContainer,uVar9,numPositiveLiteralsLowerBound,&inf),
           cVar7 != '\0')) {
LAB_005103c3:
          *(int *)(DAT_00b521c0 + 0x1e4) = *(int *)(DAT_00b521c0 + 0x1e4) + 1;
          goto LAB_00510436;
        }
        if ((unifier->_uwa)._mode == OFF) {
          if (local_170 == local_180) {
            *(int *)(DAT_00b521c0 + 0x4c) = *(int *)(DAT_00b521c0 + 0x4c) + 1;
          }
          else if (eqIsResult) {
            *(int *)(DAT_00b521c0 + 0x44) = *(int *)(DAT_00b521c0 + 0x44) + 1;
          }
          else {
            *(int *)(DAT_00b521c0 + 0x48) = *(int *)(DAT_00b521c0 + 0x48) + 1;
          }
        }
        else if (local_170 == local_180) {
          *(int *)(DAT_00b521c0 + 0x50) = *(int *)(DAT_00b521c0 + 0x50) + 1;
        }
        else if (eqIsResult) {
          *(int *)(DAT_00b521c0 + 0x54) = *(int *)(DAT_00b521c0 + 0x54) + 1;
        }
        else {
          *(int *)(DAT_00b521c0 + 0x58) = *(int *)(DAT_00b521c0 + 0x58) + 1;
        }
        inf_destroyer._destroyee = (Inference *)0x0;
        local_68._0_8_ = inf._0_8_;
        local_68._8_4_ = inf._8_4_;
        local_68._age = inf._age;
        local_68._splits = inf._splits;
        local_68._ptr1 = inf._ptr1;
        local_68._ptr2 = inf._ptr2;
        local_68.th_ancestors = inf.th_ancestors;
        local_68.all_ancestors = inf.all_ancestors;
        pCVar26 = Kernel::Clause::fromStack
                            ((Stack<Kernel::Literal_*> *)
                             res._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl,&local_68);
        if (*(int *)(Lib::env + 0x85a8) == 2) {
          extra = (InferenceExtra *)::operator_new(0x40);
          extra->_vptr_InferenceExtra = (_func_int **)&PTR__TwoLiteralRewriteInferenceExtra_00b3a660
          ;
          extra[1]._vptr_InferenceExtra = (_func_int **)&PTR__TwoLiteralInferenceExtra_00b3a5e0;
          extra[2]._vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b3a5a0;
          extra[3]._vptr_InferenceExtra = (_func_int **)rwLit;
          extra[4]._vptr_InferenceExtra = (_func_int **)eqLit;
          extra[5]._vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_00b3a620;
          extra[6]._vptr_InferenceExtra = (_func_int **)eqLHS._content;
          extra[7]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
          Lib::ProofExtra::insert((ProofExtra *)&DAT_00b521d8,&pCVar26->super_Unit,extra);
        }
        goto LAB_00510514;
      }
    }
  }
  else {
    cVar7 = (**(code **)(*(long *)&(passiveClauseContainer->super_RandomAccessClauseContainer).
                                   super_ClauseContainer + 0x80))
                      (passiveClauseContainer,numPositiveLiteralsLowerBound,&inf,&andThatsIt);
    pRVar4 = subst._refCnt;
    pRVar3 = subst._obj;
    if (cVar7 == '\0') goto LAB_0050fbac;
    if (andThatsIt != true) {
      local_a8._obj = subst._obj;
      local_a8._refCnt = subst._refCnt;
      if (subst._refCnt != (RefCounter *)0x0 && subst._obj != (ResultSubstitution *)0x0) {
        (subst._refCnt)->_val = (subst._refCnt)->_val + 1;
      }
      bVar6 = earlyWeightLimitCheck
                        (local_180,eqLit,local_170,rwLit,rwTerm,eqLHS,TVar12,&local_a8,eqIsResult,
                         passiveClauseContainer,numPositiveLiteralsLowerBound,&inf);
      uVar27 = extraout_var;
      if ((pRVar3 != (ResultSubstitution *)0x0 && pRVar4 != (RefCounter *)0x0) &&
         (pRVar4->_val = pRVar4->_val + -1, pRVar4->_val == 0)) {
        (*pRVar3->_vptr_ResultSubstitution[1])(pRVar3);
        uVar27 = 0xb521;
        *(undefined8 *)pRVar4 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar4;
      }
      local_174 = (undefined4)CONCAT71(uVar27,1);
      if (!bVar6) goto LAB_0050fcb6;
      goto LAB_0050fbb4;
    }
    *(int *)(DAT_00b521c0 + 0x1e4) = *(int *)(DAT_00b521c0 + 0x1e4) + 1;
  }
LAB_0050fcb6:
  pCVar26 = (Clause *)0x0;
LAB_00510521:
  Kernel::Inference::Destroyer::~Destroyer(&inf_destroyer);
LAB_0051052b:
  if (((subst._obj != (ResultSubstitution *)0x0) && (subst._refCnt != (RefCounter *)0x0)) &&
     (((subst._refCnt)->_val = (subst._refCnt)->_val + -1, (subst._refCnt)->_val == 0 &&
      ((*(subst._obj)->_vptr_ResultSubstitution[1])(), subst._refCnt != (RefCounter *)0x0)))) {
    *(undefined8 *)subst._refCnt = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = subst._refCnt;
  }
  return pCVar26;
LAB_00510425:
  *(int *)(DAT_00b521c0 + 0x1e8) = *(int *)(DAT_00b521c0 + 0x1e8) + 1;
LAB_00510436:
  pCVar26 = (Clause *)0x0;
LAB_00510514:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&res);
  goto LAB_00510521;
}

Assistant:

Clause* Superposition::performSuperposition(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS,
    AbstractingUnifier* unifier, bool eqIsResult)
{
  TIME_TRACE("perform superposition");
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);

  // the first checks the reference and the second checks the stack
  auto subst = ResultSubstitution::fromSubstitution(&unifier->subs(), RetrievalAlgorithms::DefaultVarBanks::query, RetrievalAlgorithms::DefaultVarBanks::internal);
  TermList eqLHSsort = SortHelper::getEqualityArgumentSort(eqLit);

  if(eqLHS.isVar()) {
    if(!checkSuperpositionFromVariable(eqClause, eqLit, eqLHS)) {
      return 0;
    }
  }

  if(!checkClauseColorCompatibility(eqClause, rwClause)) {
    return 0;
  }

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // LRS-specific optimization:
  // check whether we can conclude that the resulting clause will be discarded by LRS since it does not fulfil the age/weight limits (in which case we can discard the clause)
  // we already know the age here so we can immediately conclude whether the clause fulfils the age limit
  // since we have not built the clause yet we compute lower bounds on the weight of the clause after each step and recheck whether the weight-limit can still be fulfilled.

  unsigned numPositiveLiteralsLowerBound = Int::max(eqClause->numPositiveLiterals()-1, rwClause->numPositiveLiterals()); // lower bound on number of positive literals, don't know at this point whether duplicate positive literals will occur
  //TODO update inference rule name AYB
  Inference inf(GeneratingInference2(unifier->usesUwa() ? InferenceRule::CONSTRAINED_SUPERPOSITION : InferenceRule::SUPERPOSITION, rwClause, eqClause));
  Inference::Destroyer inf_destroyer(inf);

  auto passiveClauseContainer = _salg->getPassiveClauseContainer();
  bool andThatsIt = false;
  bool hasAgeLimitStrike = passiveClauseContainer && passiveClauseContainer->mayBeAbleToDiscriminateClausesUnderConstructionOnLimits()
                        && passiveClauseContainer->exceedsAgeLimit(numPositiveLiteralsLowerBound, inf, andThatsIt);

  if(hasAgeLimitStrike && andThatsIt) { // we are dealing with purely age-limited container (no need for weight-related investigations)
    env.statistics->discardedNonRedundantClauses++;
    RSTAT_CTR_INC("superpositions skipped for (pure) age limit before building clause");
    return 0;
  }

  if(hasAgeLimitStrike) {
    if(!earlyWeightLimitCheck(eqClause, eqLit, rwClause, rwLit, rwTerm, eqLHS, tgtTerm, subst, eqIsResult, passiveClauseContainer, numPositiveLiteralsLowerBound, inf)) {
      return 0;
    }
  }

  const auto& parRedHandler = _salg->parRedHandler();
  if (!unifier->usesUwa()) {
    if (!parRedHandler.checkSuperposition(eqClause, eqLit, rwClause, rwLit, eqIsResult, subst.ptr())) {
      return 0;
    }
  }

  const Ordering& ordering = _salg->getOrdering();

  TermList tgtTermS = subst->apply(tgtTerm, eqIsResult);

  Literal* rwLitS = subst->apply(rwLit, !eqIsResult);
  TermList rwTermS = subst->apply(rwTerm, !eqIsResult);

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  //check that we're not rewriting smaller subterm with larger
  auto comp = ordering.compare(tgtTermS,rwTermS);
  if(Ordering::isGreaterOrEqual(comp)) {
    return 0;
  }

  if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }

  if (!unifier->usesUwa()) {
    parRedHandler.insertSuperposition(
      eqClause, rwClause, rwTermS, tgtTermS, eqLHS, rwLitS, eqLit, comp, eqIsResult, subst.ptr());
  }

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,tgtTermS);

  static bool doSimS = getOptions().simulatenousSuperposition();

  //check we don't create an equational tautology (this happens during self-superposition)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  TermList eqLHSS = subst->apply(eqLHS, eqIsResult);

#if VDEBUG
  if(!unifier->usesUwa()){
    ASS_EQ(rwTermS,eqLHSS);
  }
#endif

  Recycled<Stack<Literal*>> res;
  res->reserve(rwLength + eqLength - 1 + unifier->maxNumberOfConstraints());

  bool synthesis = (env.options->questionAnswering() == Options::QuestionAnsweringMode::SYNTHESIS);
  Literal* rwAnsLit = synthesis ? rwClause->getAnswerLiteral() : nullptr;
  Literal* eqAnsLit = synthesis ? eqClause->getAnswerLiteral() : nullptr;
  bool bothHaveAnsLit = (rwAnsLit != nullptr) && (eqAnsLit != nullptr);

  static bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  res->push(tgtLitS);
  unsigned weight=tgtLitS->weight();
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr=(*rwClause)[i];
    if(curr!=rwLit && (!bothHaveAnsLit || curr!=rwAnsLit)) {
      Literal* currAfter = subst->apply(curr, !eqIsResult);

      if (doSimS) {
        currAfter = EqHelper::replace(currAfter,rwTermS,tgtTermS);
      }

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      if(hasAgeLimitStrike) {
        weight+=currAfter->weight();
        if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
          RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
          env.statistics->discardedNonRedundantClauses++;
          return nullptr;
        }
      }

      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK)
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      res->push(currAfter);
    }
  }

  {
    Literal* eqLitS = 0;
    if (afterCheck && eqClause->numSelected() > 1) {
      TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
      eqLitS = Literal::createEquality(true,eqLHSS,tgtTermS,eqLHSsort);
    }

    for(unsigned i=0;i<eqLength;i++) {
      Literal* curr=(*eqClause)[i];
      if(curr!=eqLit) {
        Literal* currAfter = subst->apply(curr, eqIsResult);

        if(EqHelper::isEqTautology(currAfter)) {
          return nullptr;
        }
        if(hasAgeLimitStrike) {
          weight+=currAfter->weight();
          if(passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
            RSTAT_CTR_INC("superpositions skipped for weight limit while constructing other literals");
            env.statistics->discardedNonRedundantClauses++;
            return nullptr;
          }
        }

        if (eqLitS && i < eqClause->numSelected()) {
          TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);

          Ordering::Result o = ordering.compare(currAfter,eqLitS);

          if (o == Ordering::GREATER || o == Ordering::EQUAL) {
            env.statistics->inferencesBlockedForOrderingAftercheck++;
            return nullptr;
          }
        }

        res->push(currAfter);
      }
    }
  }

  res->loadFromIterator(unifier->computeConstraintLiterals()->iter());

  if (bothHaveAnsLit) {
    Literal* newLitC = subst->apply(rwAnsLit, !eqIsResult);
    Literal* newLitD = subst->apply(eqAnsLit, eqIsResult);
    Literal* condLit = subst->apply(eqLit, eqIsResult);
    res->push(SynthesisALManager::getInstance()->makeITEAnswerLiteral(condLit, newLitC, newLitD));
  }

  if(hasAgeLimitStrike && passiveClauseContainer->exceedsWeightLimit(weight, numPositiveLiteralsLowerBound, inf)) {
    RSTAT_CTR_INC("superpositions skipped for weight limit after the clause was built");
    env.statistics->discardedNonRedundantClauses++;
    return nullptr;
  }

  if(!unifier->usesUwa()){
    if(rwClause==eqClause) {
      env.statistics->selfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->forwardSuperposition++;
    } else {
      env.statistics->backwardSuperposition++;
    }
  } else {
    if(rwClause==eqClause) {
      env.statistics->cSelfSuperposition++;
    } else if(eqIsResult) {
      env.statistics->cForwardSuperposition++;
    } else {
      env.statistics->cBackwardSuperposition++;
    }
  }

  inf_destroyer.disable(); // ownership passed to the the clause below
  auto clause = Clause::fromStack(*res, inf);

  if(env.options->proofExtra() == Options::ProofExtra::FULL)
    env.proofExtra.insert(clause, new SuperpositionExtra(
      rwLit,
      eqLit,
      eqLHS,
      rwTerm
    ));

  return clause;
}